

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

void liu::get_input_label(string *filename,Mat *input,Mat *label,int sample_num,int start)

{
  Rect_<int> local_268;
  Mat local_258 [96];
  Rect_<int> local_1f8;
  Mat local_1e8 [96];
  FileNode local_188 [24];
  FileNode local_170 [24];
  undefined1 local_158 [8];
  Mat target_;
  undefined1 local_f8 [8];
  Mat input_;
  string local_88 [32];
  FileStorage local_68 [8];
  FileStorage fs;
  int start_local;
  int sample_num_local;
  Mat *label_local;
  Mat *input_local;
  string *filename_local;
  
  cv::FileStorage::FileStorage(local_68);
  std::__cxx11::string::string(local_88);
  cv::FileStorage::open((string *)local_68,(int)filename,(string *)0x0);
  std::__cxx11::string::~string(local_88);
  cv::Mat::Mat((Mat *)local_f8);
  cv::Mat::Mat((Mat *)local_158);
  cv::FileStorage::operator[]((char *)local_170);
  cv::operator>>(local_170,(Mat *)local_f8);
  cv::FileStorage::operator[]((char *)local_188);
  cv::operator>>(local_188,(Mat *)local_158);
  cv::FileStorage::release();
  cv::Rect_<int>::Rect_(&local_1f8,start,0,sample_num,_input_);
  cv::Mat::operator()(local_1e8,(Rect *)local_f8);
  cv::Mat::operator=(input,local_1e8);
  cv::Mat::~Mat(local_1e8);
  cv::Rect_<int>::Rect_(&local_268,start,0,sample_num,_target_);
  cv::Mat::operator()(local_258,(Rect *)local_158);
  cv::Mat::operator=(label,local_258);
  cv::Mat::~Mat(local_258);
  cv::Mat::~Mat((Mat *)local_158);
  cv::Mat::~Mat((Mat *)local_f8);
  cv::FileStorage::~FileStorage(local_68);
  return;
}

Assistant:

void get_input_label(std::string filename, cv::Mat& input, cv::Mat& label, int sample_num, int start)
	{
		cv::FileStorage fs;
		fs.open(filename, cv::FileStorage::READ);
		cv::Mat input_, target_;
		fs["input"] >> input_;
		fs["target"] >> target_;
		fs.release();
		input = input_(cv::Rect(start, 0, sample_num, input_.rows));
		label = target_(cv::Rect(start, 0, sample_num, target_.rows));
	}